

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O2

int Llb_NonlinQuantify2(Llb_Mgr_t *p,Llb_Prt_t *pPart1,Llb_Prt_t *pPart2)

{
  int *piVar1;
  Llb_Var_t *pLVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  DdNode *pDVar6;
  DdNode *n;
  Llb_Prt_t *pLVar7;
  Vec_Int_t *pVVar8;
  Vec_Ptr_t *p_00;
  long lVar9;
  
  pDVar6 = Llb_NonlinCreateCube2(p,pPart1,pPart2);
  Cudd_Ref(pDVar6);
  n = Cudd_bddAndAbstract(p->dd,pPart1->bFunc,pPart2->bFunc,pDVar6);
  if (n == (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->dd,pDVar6);
    iVar3 = 0;
  }
  else {
    Cudd_Ref(n);
    Cudd_RecursiveDeref(p->dd,pDVar6);
    pLVar7 = (Llb_Prt_t *)calloc(1,0x18);
    iVar3 = p->iPartFree;
    p->pParts[iVar3] = pLVar7;
    p->iPartFree = iVar3 + 1;
    pLVar7->iPart = iVar3;
    pDVar6 = n;
    iVar3 = Cudd_DagSize(n);
    pLVar7->nSize = iVar3;
    pLVar7->bFunc = n;
    pVVar8 = Vec_IntAlloc((int)pDVar6);
    pLVar7->vVars = pVVar8;
    for (iVar3 = 0; iVar3 < pPart1->vVars->nSize; iVar3 = iVar3 + 1) {
      iVar4 = Vec_IntEntry(pPart1->vVars,iVar3);
      pLVar2 = p->pVars[iVar4];
      iVar4 = Vec_IntRemove(pLVar2->vParts,pPart1->iPart);
      if (iVar4 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb3Image.c"
                      ,0x194,"int Llb_NonlinQuantify2(Llb_Mgr_t *, Llb_Prt_t *, Llb_Prt_t *)");
      }
      piVar1 = &pLVar2->nScore;
      *piVar1 = *piVar1 - pPart1->nSize;
    }
    for (iVar3 = 0; iVar3 < pPart2->vVars->nSize; iVar3 = iVar3 + 1) {
      iVar4 = Vec_IntEntry(pPart2->vVars,iVar3);
      pLVar2 = p->pVars[iVar4];
      iVar4 = Vec_IntRemove(pLVar2->vParts,pPart2->iPart);
      if (iVar4 == 0) {
        __assert_fail("RetValue",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb3Image.c"
                      ,0x19b,"int Llb_NonlinQuantify2(Llb_Mgr_t *, Llb_Prt_t *, Llb_Prt_t *)");
      }
      piVar1 = &pLVar2->nScore;
      *piVar1 = *piVar1 - pPart2->nSize;
    }
    Extra_SupportArray(p->dd,n,p->pSupp);
    iVar3 = 0;
    for (lVar9 = 0; lVar9 < p->nVars; lVar9 = lVar9 + 1) {
      iVar4 = p->pSupp[lVar9];
      if ((iVar4 != 0) && (p->pVars2Q[lVar9] != 0)) {
        pLVar2 = p->pVars[lVar9];
        piVar1 = &pLVar2->nScore;
        *piVar1 = *piVar1 + pLVar7->nSize;
        Vec_IntPush(pLVar2->vParts,pLVar7->iPart);
        Vec_IntPush(pLVar7->vVars,(int)lVar9);
      }
      iVar3 = iVar3 + iVar4;
    }
    if (iVar3 < p->nSuppMax) {
      iVar3 = p->nSuppMax;
    }
    p->nSuppMax = iVar3;
    p_00 = Vec_PtrAlloc(0);
    for (iVar3 = 0; iVar3 < pPart1->vVars->nSize; iVar3 = iVar3 + 1) {
      iVar5 = Vec_IntEntry(pPart1->vVars,iVar3);
      pVVar8 = p->pVars[iVar5]->vParts;
      iVar4 = pVVar8->nSize;
      if (iVar4 == 1) {
        iVar4 = Vec_IntEntry(pVVar8,0);
        Vec_PtrPushUnique(p_00,p->pParts[iVar4]);
      }
      else if (iVar4 == 0) {
        Llb_NonlinRemoveVar(p,p->pVars[iVar5]);
      }
    }
    for (iVar3 = 0; iVar3 < pPart2->vVars->nSize; iVar3 = iVar3 + 1) {
      iVar4 = Vec_IntEntry(pPart2->vVars,iVar3);
      pLVar2 = p->pVars[iVar4];
      if (pLVar2 != (Llb_Var_t *)0x0) {
        iVar4 = pLVar2->vParts->nSize;
        if (iVar4 == 1) {
          iVar4 = Vec_IntEntry(pLVar2->vParts,0);
          Vec_PtrPushUnique(p_00,p->pParts[iVar4]);
        }
        else if (iVar4 == 0) {
          Llb_NonlinRemoveVar(p,pLVar2);
        }
      }
    }
    Llb_NonlinRemovePart(p,pPart1);
    Llb_NonlinRemovePart(p,pPart2);
    iVar3 = p_00->nSize;
    iVar4 = 0;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    for (; iVar3 != iVar4; iVar4 = iVar4 + 1) {
      pLVar7 = (Llb_Prt_t *)Vec_PtrEntry(p_00,iVar4);
      Llb_NonlinQuantify1(p,pLVar7,0);
    }
    Vec_PtrFree(p_00);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int Llb_NonlinQuantify2( Llb_Mgr_t * p, Llb_Prt_t * pPart1, Llb_Prt_t * pPart2 )
{
    int fVerbose = 0;
    Llb_Var_t * pVar;
    Llb_Prt_t * pTemp;
    Vec_Ptr_t * vSingles;
    DdNode * bCube, * bFunc;
    int i, RetValue, nSuppSize;
//    int iPart1 = pPart1->iPart;
//    int iPart2 = pPart2->iPart;

    // create cube to be quantified
    bCube = Llb_NonlinCreateCube2( p, pPart1, pPart2 );   Cudd_Ref( bCube );
if ( fVerbose )
{
printf( "\n" );
printf( "\n" );
Llb_NonlinPrint( p );
printf( "Conjoining partitions %d and %d.\n", pPart1->iPart, pPart2->iPart );
Extra_bddPrintSupport( p->dd, bCube );  printf( "\n" );
}
 
    // derive new function
//    bFunc = Cudd_bddAndAbstract( p->dd, pPart1->bFunc, pPart2->bFunc, bCube );  Cudd_Ref( bFunc );
/*
    bFunc = Cudd_bddAndAbstractLimit( p->dd, pPart1->bFunc, pPart2->bFunc, bCube, Limit );  
    if ( bFunc == NULL )
    {
        int RetValue;
        Cudd_RecursiveDeref( p->dd, bCube );
        if ( pPart1->nSize < pPart2->nSize )
            RetValue = Llb_NonlinQuantify1( p, pPart1, 1 );
        else
            RetValue = Llb_NonlinQuantify1( p, pPart2, 1 );
        if ( RetValue )
            Limit = Limit + 1000;
        Llb_NonlinQuantify2( p, pPart1, pPart2 );
        return 0;
    }
    Cudd_Ref( bFunc );
*/

//    bFunc = Extra_bddAndAbstractTime( p->dd, pPart1->bFunc, pPart2->bFunc, bCube, TimeOut );  
    bFunc = Cudd_bddAndAbstract( p->dd, pPart1->bFunc, pPart2->bFunc, bCube );  
    if ( bFunc == NULL )
    {
        Cudd_RecursiveDeref( p->dd, bCube );
        return 0;
    }
    Cudd_Ref( bFunc );
    Cudd_RecursiveDeref( p->dd, bCube );

    // create new partition
    pTemp = p->pParts[p->iPartFree] = ABC_CALLOC( Llb_Prt_t, 1 );
    pTemp->iPart = p->iPartFree++;
    pTemp->nSize = Cudd_DagSize(bFunc);
    pTemp->bFunc = bFunc;
    pTemp->vVars = Vec_IntAlloc( 8 );
    // update variables
    Llb_PartForEachVar( p, pPart1, pVar, i )
    {
        RetValue = Vec_IntRemove( pVar->vParts, pPart1->iPart );
        assert( RetValue );
        pVar->nScore -= pPart1->nSize;
    }
    // update variables
    Llb_PartForEachVar( p, pPart2, pVar, i )
    {
        RetValue = Vec_IntRemove( pVar->vParts, pPart2->iPart );
        assert( RetValue );
        pVar->nScore -= pPart2->nSize;
    }
    // add variables to the new partition
    nSuppSize = 0;
    Extra_SupportArray( p->dd, bFunc, p->pSupp );
    for ( i = 0; i < p->nVars; i++ )
    {
        nSuppSize += p->pSupp[i];
        if ( p->pSupp[i] && p->pVars2Q[i] )
        {
            pVar = Llb_MgrVar( p, i );
            pVar->nScore += pTemp->nSize;
            Vec_IntPush( pVar->vParts, pTemp->iPart );
            Vec_IntPush( pTemp->vVars, i );
        }
    }
    p->nSuppMax = Abc_MaxInt( p->nSuppMax, nSuppSize ); 
    // remove variables and collect partitions with singleton variables
    vSingles = Vec_PtrAlloc( 0 );
    Llb_PartForEachVar( p, pPart1, pVar, i )
    {
        if ( Vec_IntSize(pVar->vParts) == 0 )
            Llb_NonlinRemoveVar( p, pVar );
        else if ( Vec_IntSize(pVar->vParts) == 1 )
        {
            if ( fVerbose )
                printf( "Adding partition %d because of var %d.\n", 
                    Llb_MgrPart(p, Vec_IntEntry(pVar->vParts,0))->iPart, pVar->iVar );
            Vec_PtrPushUnique( vSingles, Llb_MgrPart(p, Vec_IntEntry(pVar->vParts,0)) );
        }
    }
    Llb_PartForEachVar( p, pPart2, pVar, i )
    {
        if ( pVar == NULL )
            continue;
        if ( Vec_IntSize(pVar->vParts) == 0 )
            Llb_NonlinRemoveVar( p, pVar );
        else if ( Vec_IntSize(pVar->vParts) == 1 )
        {
            if ( fVerbose )
                printf( "Adding partition %d because of var %d.\n", 
                    Llb_MgrPart(p, Vec_IntEntry(pVar->vParts,0))->iPart, pVar->iVar );
            Vec_PtrPushUnique( vSingles, Llb_MgrPart(p, Vec_IntEntry(pVar->vParts,0)) );
        }
    }
    // remove partitions
    Llb_NonlinRemovePart( p, pPart1 );
    Llb_NonlinRemovePart( p, pPart2 );
    // remove other variables
if ( fVerbose )
Llb_NonlinPrint( p );
    Vec_PtrForEachEntry( Llb_Prt_t *, vSingles, pTemp, i )
    {
if ( fVerbose )
printf( "Updating partitiong %d with singlton vars.\n", pTemp->iPart );
        Llb_NonlinQuantify1( p, pTemp, 0 );
    }
if ( fVerbose )
Llb_NonlinPrint( p );
    Vec_PtrFree( vSingles );
    return 1;
}